

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QString * __thiscall
QCommandLineParser::errorText(QString *__return_storage_ptr__,QCommandLineParser *this)

{
  QCommandLineParserPrivate *other;
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  other = this->d;
  if ((other->errorText).d.size == 0) {
    lVar1 = (other->unknownOptionNames).d.size;
    if (lVar1 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0038f21d;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      if (lVar1 == 1) {
        tr((QString *)&local_38,"Unknown option \'%1\'.",(char *)0x0,-1);
        QString::arg<QString,_true>
                  (__return_storage_ptr__,(QString *)&local_38,(this->d->unknownOptionNames).d.ptr,0
                   ,(QChar)0x20);
      }
      else {
        tr((QString *)&local_38,"Unknown options: %1.",(char *)0x0,-1);
        local_68.d = (Data *)0x0;
        local_80.d = (Data *)0x0;
        local_80.ptr = (char16_t *)0x0;
        local_68.ptr = L", ";
        local_80.size = 0;
        local_68.size = 2;
        QListSpecialMethods<QString>::join
                  ((QString *)&local_50,(QListSpecialMethods<QString> *)&this->d->unknownOptionNames
                   ,(QString *)&local_68);
        QString::arg<QString,_true>
                  (__return_storage_ptr__,(QString *)&local_38,(QString *)&local_50,0,(QChar)0x20);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0038f21d:
        __stack_chk_fail();
      }
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0038f21d;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)other);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCommandLineParser::errorText() const
{
    if (!d->errorText.isEmpty())
        return d->errorText;
    if (d->unknownOptionNames.size() == 1)
        return tr("Unknown option '%1'.").arg(d->unknownOptionNames.constFirst());
    if (d->unknownOptionNames.size() > 1)
        return tr("Unknown options: %1.").arg(d->unknownOptionNames.join(QStringLiteral(", ")));
    return QString();
}